

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonparser.cpp
# Opt level: O0

QCborValue * __thiscall
StashedContainer::intoValue
          (StashedContainer *this,QExplicitlySharedDataPointer<QCborContainerPrivate> *parent)

{
  undefined8 in_RDX;
  QExplicitlySharedDataPointer<QCborContainerPrivate> *in_RSI;
  QCborValue *in_RDI;
  ContainerDisposition disp;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 uVar1;
  QCborValue *n;
  Type type;
  
  type = (Type)((ulong)in_RDX >> 0x20);
  n = in_RDI;
  std::swap<QExplicitlySharedDataPointer<QCborContainerPrivate>>
            ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)in_RDI,in_RSI);
  disp = (ContainerDisposition)((ulong)in_RDI >> 0x20);
  uVar1 = *(undefined4 *)&(in_RSI->d).ptr;
  QExplicitlySharedDataPointer<QCborContainerPrivate>::take(in_RSI);
  QCborContainerPrivate::makeValue
            (type,(qint64)n,(QCborContainerPrivate *)CONCAT44(uVar1,in_stack_ffffffffffffffd8),disp)
  ;
  return n;
}

Assistant:

QCborValue intoValue(QExplicitlySharedDataPointer<QCborContainerPrivate> *parent)
    {
        std::swap(stashed, *parent);
        return QCborContainerPrivate::makeValue(type, -1, stashed.take(),
                                                QCborContainerPrivate::MoveContainer);
    }